

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token)

{
  ushort uVar1;
  ValueHolder *pVVar2;
  ValueHolder VVar3;
  _Elt_pointer ppVVar4;
  Location pCVar5;
  ValueHolder VVar6;
  ValueHolder VVar7;
  bool bVar8;
  _Elt_pointer ppVVar9;
  _Elt_pointer ppVVar10;
  string decoded;
  string local_68;
  ValueHolder local_48;
  ushort local_40;
  ValueHolder local_30;
  ValueHolder VStack_28;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  bVar8 = decodeString(this,token,&local_68);
  if (bVar8) {
    Value::Value((Value *)&local_48,&local_68);
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar9 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar2 = &ppVVar9[-1]->value_;
    uVar1 = *(ushort *)(pVVar2 + 1);
    *(ushort *)(pVVar2 + 1) = uVar1 & 0xff00 | local_40 & 0xff;
    VVar3 = *pVVar2;
    *pVVar2 = local_48;
    *(ushort *)(pVVar2 + 1) = uVar1 & 0xfe00 | local_40 & 0xff | local_40 & 0x100;
    local_40 = local_40 & 0xfe00 | uVar1 & 0xff | uVar1 & 0x100;
    VVar6 = pVVar2[3];
    VVar7 = pVVar2[4];
    pVVar2[3] = local_30;
    pVVar2[4] = VStack_28;
    local_48 = VVar3;
    local_30 = VVar6;
    VStack_28 = VVar7;
    Value::~Value((Value *)&local_48);
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar10 = ppVVar9;
    if (ppVVar9 == ppVVar4) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar5 = this->begin_;
    ppVVar10[-1]->start_ = (long)token->start_ - (long)pCVar5;
    if (ppVVar9 == ppVVar4) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar9[-1]->limit_ = (long)token->end_ - (long)pCVar5;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return bVar8;
}

Assistant:

bool Reader::decodeString(Token& token) {
  std::string decoded;
  if (!decodeString(token, decoded))
    return false;
  currentValue() = decoded;
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}